

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O2

size_t __thiscall duckdb::WindowNaiveState::Hash(WindowNaiveState *this,idx_t rid)

{
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_00;
  size_t sVar1;
  pointer pWVar2;
  sel_t s;
  SelectionVector sel;
  
  this_00 = &(this->super_WindowAggregatorLocalState).cursor;
  pWVar2 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->(this_00);
  s = (int)rid - (int)(pWVar2->state).current_row_index;
  pWVar2 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->(this_00);
  SelectionVector::SelectionVector(&sel,&s);
  DataChunk::Slice(&this->leaves,&pWVar2->chunk,&sel,1,0);
  DataChunk::Hash(&this->leaves,&this->hashes);
  sVar1 = *(size_t *)(this->hashes).data;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return sVar1;
}

Assistant:

size_t WindowNaiveState::Hash(idx_t rid) {
	D_ASSERT(cursor->RowIsVisible(rid));
	auto s = cursor->RowOffset(rid);
	auto &scanned = cursor->chunk;
	SelectionVector sel(&s);
	leaves.Slice(scanned, sel, 1);
	leaves.Hash(hashes);

	return *FlatVector::GetData<hash_t>(hashes);
}